

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftstroke.c
# Opt level: O1

FT_Error FT_Stroker_EndSubPath(FT_Stroker stroker)

{
  int iVar1;
  uint uVar2;
  FT_Pos FVar3;
  FT_Error FVar4;
  FT_Vector *pFVar5;
  FT_Angle FVar6;
  FT_Vector *pFVar7;
  FT_Int in_EDX;
  FT_Int extraout_EDX;
  FT_Int extraout_EDX_00;
  FT_Int side;
  FT_Vector *pFVar8;
  FT_Bool reverse;
  ulong uVar9;
  byte *pbVar10;
  FT_UInt FVar11;
  FT_StrokeBorder border;
  FT_StrokeBorder right;
  FT_UInt new_points;
  
  if (stroker == (FT_Stroker)0x0) {
    return 6;
  }
  if (stroker->subpath_open == '\0') {
    if ((((stroker->center).x != (stroker->subpath_start).x) ||
        ((stroker->center).y != (stroker->subpath_start).y)) &&
       (FVar4 = FT_Stroker_LineTo(stroker,&stroker->subpath_start), FVar4 != 0)) {
      return FVar4;
    }
    stroker->angle_out = stroker->subpath_angle;
    FVar6 = FT_Angle_Diff(stroker->angle_in,stroker->subpath_angle);
    if (FVar6 != 0) {
      FVar4 = ft_stroker_inside(stroker,(uint)((ulong)FVar6 >> 0x3f),stroker->subpath_line_length);
      if (FVar4 != 0) {
        return FVar4;
      }
      FVar4 = ft_stroker_outside(stroker,(uint)(-1 < FVar6),stroker->subpath_line_length);
      if (FVar4 != 0) {
        return FVar4;
      }
    }
    ft_stroke_border_close(stroker->borders,'\0');
    border = stroker->borders + 1;
    reverse = '\x01';
  }
  else {
    FVar4 = ft_stroker_cap(stroker,stroker->angle_in,in_EDX);
    if (FVar4 != 0) {
      return FVar4;
    }
    border = stroker->borders;
    FVar11 = stroker->borders[1].num_points;
    iVar1 = stroker->borders[1].start;
    new_points = FVar11 - iVar1;
    if (new_points == 0 || (int)FVar11 < iVar1) {
      FVar4 = 0;
      side = extraout_EDX;
    }
    else {
      FVar4 = ft_stroke_border_grow(border,new_points);
      side = extraout_EDX_00;
      if (FVar4 == 0) {
        pFVar8 = stroker->borders[1].points;
        uVar9 = (ulong)stroker->borders[1].num_points;
        pFVar5 = pFVar8 + (uVar9 - 1);
        FVar11 = stroker->borders[1].start;
        pFVar8 = pFVar8 + (int)FVar11;
        if (pFVar8 <= pFVar5) {
          uVar2 = stroker->borders[0].num_points;
          pFVar8 = (FT_Vector *)(stroker->borders[0].tags + uVar2);
          pFVar7 = stroker->borders[0].points + uVar2;
          pbVar10 = stroker->borders[1].tags + uVar9;
          do {
            pbVar10 = pbVar10 + -1;
            FVar3 = pFVar5->y;
            pFVar7->x = pFVar5->x;
            pFVar7->y = FVar3;
            *(byte *)&pFVar8->x = *pbVar10 & 0xf3;
            pFVar7 = pFVar7 + 1;
            pFVar8 = (FT_Vector *)((long)&pFVar8->x + 1);
            pFVar5 = pFVar5 + -1;
            FVar11 = stroker->borders[1].start;
          } while (stroker->borders[1].points + (int)FVar11 <= pFVar5);
        }
        side = (FT_Int)pFVar8;
        stroker->borders[1].num_points = FVar11;
        stroker->borders[0].num_points = stroker->borders[0].num_points + new_points;
        FVar4 = 0;
        stroker->borders[0].movable = '\0';
        stroker->borders[1].movable = '\0';
      }
    }
    if (FVar4 != 0) {
      return FVar4;
    }
    FVar3 = (stroker->subpath_start).y;
    (stroker->center).x = (stroker->subpath_start).x;
    (stroker->center).y = FVar3;
    FVar4 = ft_stroker_cap(stroker,stroker->subpath_angle + 0xb40000,side);
    if (FVar4 != 0) {
      return FVar4;
    }
    reverse = '\0';
  }
  ft_stroke_border_close(border,reverse);
  return 0;
}

Assistant:

FT_EXPORT_DEF( FT_Error )
  FT_Stroker_EndSubPath( FT_Stroker  stroker )
  {
    FT_Error  error = FT_Err_Ok;


    if ( !stroker )
    {
      error = FT_THROW( Invalid_Argument );
      goto Exit;
    }

    if ( stroker->subpath_open )
    {
      FT_StrokeBorder  right = stroker->borders;


      /* All right, this is an opened path, we need to add a cap between */
      /* right & left, add the reverse of left, then add a final cap     */
      /* between left & right.                                           */
      error = ft_stroker_cap( stroker, stroker->angle_in, 0 );
      if ( error )
        goto Exit;

      /* add reversed points from `left' to `right' */
      error = ft_stroker_add_reverse_left( stroker, TRUE );
      if ( error )
        goto Exit;

      /* now add the final cap */
      stroker->center = stroker->subpath_start;
      error = ft_stroker_cap( stroker,
                              stroker->subpath_angle + FT_ANGLE_PI, 0 );
      if ( error )
        goto Exit;

      /* Now end the right subpath accordingly.  The left one is */
      /* rewind and doesn't need further processing.             */
      ft_stroke_border_close( right, FALSE );
    }
    else
    {
      FT_Angle  turn;
      FT_Int    inside_side;


      /* close the path if needed */
      if ( stroker->center.x != stroker->subpath_start.x ||
           stroker->center.y != stroker->subpath_start.y )
      {
         error = FT_Stroker_LineTo( stroker, &stroker->subpath_start );
         if ( error )
           goto Exit;
      }

      /* process the corner */
      stroker->angle_out = stroker->subpath_angle;
      turn               = FT_Angle_Diff( stroker->angle_in,
                                          stroker->angle_out );

      /* no specific corner processing is required if the turn is 0 */
      if ( turn != 0 )
      {
        /* when we turn to the right, the inside side is 0 */
        /* otherwise, the inside side is 1 */
        inside_side = ( turn < 0 );

        error = ft_stroker_inside( stroker,
                                   inside_side,
                                   stroker->subpath_line_length );
        if ( error )
          goto Exit;

        /* process the outside side */
        error = ft_stroker_outside( stroker,
                                    !inside_side,
                                    stroker->subpath_line_length );
        if ( error )
          goto Exit;
      }

      /* then end our two subpaths */
      ft_stroke_border_close( stroker->borders + 0, FALSE );
      ft_stroke_border_close( stroker->borders + 1, TRUE );
    }

  Exit:
    return error;
  }